

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_direct(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  CTcSymbol *sym_00;
  
  sym_00 = CTcPrsSymtab::find_direct(&this->super_CTcPrsSymtab,sym,len);
  if (sym_00 == (CTcSymbol *)0x0) {
    sym_00 = find_local(this,sym,len);
    if ((sym_00 == (CTcSymbol *)0x0) &&
       (sym_00 = find_global(this,sym,len), sym_00 == (CTcSymbol *)0x0)) {
      return (CTcSymbol *)0x0;
    }
    CTcPrsSymtab::add_entry(&this->super_CTcPrsSymtab,sym_00);
  }
  return sym_00;
}

Assistant:

virtual CTcSymbol *find_direct(const textchar_t *sym, size_t len)
    {
        /* first, check the cache to see if we've already looked it up */
        CTcSymbol *ret = CTcPrsSymtab::find_direct(sym, len);
        if (ret != 0)
            return ret;

        /* 
         *   Didn't find it - check the user-code tables.
         */

        /* try our local symbol table */
        ret = find_local(sym, len);

        /* if that didn't work, try our global symbol table */
        if (ret == 0)
            ret = find_global(sym, len);

        /* if we found a symbol, add it to the cache */
        if (ret != 0)
            CTcPrsSymtab::add_entry(ret);

        /* return the symbol */
        return ret;
    }